

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

int line_x2_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object node;
  
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)END_NODE);
  Am_Object::Am_Object(&node,pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&node,100);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&node,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&node);
  return iVar2 / 2 + iVar1;
}

Assistant:

Am_Define_Formula(int, line_x2)
{
  Am_Object node = self.Get(END_NODE);
  return (int)node.Get(Am_LEFT) + (int)node.Get(Am_WIDTH) / 2;
}